

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_max.hpp
# Opt level: O0

pair<int_*,_int>
burst::partial_sum_max<int*,int*,std::plus<void>,std::less<void>>(int *first,int *last,int *result)

{
  bool bVar1;
  pair<int_*,_int> pVar2;
  int local_4c;
  int local_48;
  int local_44;
  int new_sum;
  int current;
  int max;
  int sum;
  int *result_local;
  int *last_local;
  int *first_local;
  undefined1 local_18 [12];
  
  _max = result;
  result_local = last;
  last_local = first;
  if (first == last) {
    local_4c = 0;
    std::pair<int_*,_int>::pair<int_*&,_int,_true>
              ((pair<int_*,_int> *)local_18,(int **)&max,&local_4c);
  }
  else {
    new_sum = *first;
    *result = new_sum;
    current = new_sum;
    while (last_local = last_local + 1, last_local != result_local) {
      local_44 = *last_local;
      bVar1 = (((std::forward<int&>)({parm#1}))<((std::forward<int&>)({parm#2})))std::less<void>::
              operator()((void *)((long)&first_local + 6),&new_sum,&local_44);
      if (bVar1) {
        new_sum = local_44;
      }
      local_48 = std::plus<void>::operator()
                           ((plus<void> *)((long)&first_local + 7),&current,&local_44);
      _max = _max + 1;
      *_max = local_48;
      current = local_48;
    }
    _max = _max + 1;
    std::pair<int_*,_int>::pair<int_*&,_int_&,_true>
              ((pair<int_*,_int> *)local_18,(int **)&max,&new_sum);
  }
  pVar2._12_4_ = 0;
  pVar2.first = (int *)local_18._0_8_;
  pVar2.second = local_18._8_4_;
  return pVar2;
}

Assistant:

std::pair<OutputIterator, iterator_value_t<InputIterator>>
        partial_sum_max
        (
            InputIterator first,
            InputIterator last,
            OutputIterator result,
            BinaryFunction plus,
            BinaryPredicate less
        )
    {
        if (first != last)
        {
            auto sum = *first;
            auto max = sum;

            *result = sum;

            while (++first != last)
            {
                auto current = *first;
                if (less(max, current))
                {
                    max = current;
                }

                auto new_sum = plus(std::move(sum), std::move(current));
                sum = std::move(new_sum);

                ++result;
                *result = sum;
            }

            return {++result, max};
        }

        return {result, iterator_value_t<InputIterator>{}};
    }